

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.cpp
# Opt level: O2

Result __thiscall
tonk::UDPSocket::InjectRecvfrom(UDPSocket *this,UDPAddress *addr,uint8_t *data,uint bytes)

{
  Lock *pLVar1;
  BufferResult BVar2;
  uint64_t receiveUsec;
  uint8_t *readBuffer;
  undefined4 in_register_0000000c;
  Result *success;
  uint in_R8D;
  Locker locker;
  Locker local_40;
  UDPAddress *local_38;
  
  local_38 = (UDPAddress *)data;
  receiveUsec = siamese::GetTimeUsec();
  pLVar1 = *(Lock **)((long)&addr[4].impl_.data_ + 0x10);
  local_40.TheLock = pLVar1;
  std::recursive_mutex::lock(&pLVar1->cs);
  readBuffer = pktalloc::Allocator::Allocate((Allocator *)(pLVar1 + 1),in_R8D);
  Locker::~Locker(&local_40);
  if (readBuffer == (uint8_t *)0x0) {
    Result::OutOfMemory();
  }
  else {
    memcpy(readBuffer,(void *)CONCAT44(in_register_0000000c,bytes),(ulong)in_R8D);
    BVar2 = onUDPDatagram((UDPSocket *)addr,receiveUsec,local_38,readBuffer,in_R8D);
    if (BVar2 != InUse) {
      pLVar1 = *(Lock **)((long)&addr[4].impl_.data_ + 0x10);
      local_40.TheLock = pLVar1;
      std::recursive_mutex::lock(&pLVar1->cs);
      pktalloc::Allocator::Free((Allocator *)(pLVar1 + 1),readBuffer);
      Locker::~Locker(&local_40);
    }
    (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)0x0;
  }
  return (Result)(ErrorResult *)this;
}

Assistant:

Result UDPSocket::InjectRecvfrom(
    const UDPAddress& addr,
    const uint8_t* data,
    unsigned bytes)
{
    // Grab the receive timestamp right away
    const uint64_t receiveUsec = siamese::GetTimeUsec();

    uint8_t* buffer = Deps.ReadBufferAllocator->Allocate(bytes);
    if (!buffer) {
        return Result::OutOfMemory();
    }
    memcpy(buffer, data, bytes);

    const BufferResult result = onUDPDatagram(receiveUsec, addr, buffer, bytes);
    if (result == BufferResult::Free) {
        Deps.ReadBufferAllocator->Free(buffer);
    }

    return Result::Success();
}